

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O0

int grad_calc2(custom_function *funcpt,double *x,int N,double *dx,double eps3,double *f)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double fm;
  double fp;
  double temp;
  double stepmax;
  double stepsize;
  int retval;
  int j;
  double *f_local;
  double eps3_local;
  double *dx_local;
  int N_local;
  double *x_local;
  custom_function *funcpt_local;
  
  stepsize._4_4_ = 0;
  while( true ) {
    if (N <= stepsize._4_4_) {
      return 0;
    }
    if (ABS(x[stepsize._4_4_]) < 1.0 / ABS(dx[stepsize._4_4_])) {
      dVar2 = signx(x[stepsize._4_4_]);
      temp = (dVar2 * 1.0) / ABS(dx[stepsize._4_4_]);
    }
    else {
      temp = x[stepsize._4_4_];
    }
    dVar2 = x[stepsize._4_4_];
    x[stepsize._4_4_] = temp * eps3 + x[stepsize._4_4_];
    dVar1 = x[stepsize._4_4_];
    dVar3 = (*funcpt->funcpt)(x,N,funcpt->params);
    if ((1.79769313486232e+308 <= dVar3) || (dVar3 <= -1.79769313486232e+308)) {
      printf("Program Exiting as the function value exceeds the maximum double value");
      return 0xf;
    }
    if (NAN(dVar3)) {
      printf("Program Exiting as the function returns NaN");
      return 0xf;
    }
    x[stepsize._4_4_] = dVar2 - (dVar1 - dVar2);
    dVar4 = (*funcpt->funcpt)(x,N,funcpt->params);
    if ((1.79769313486232e+308 <= dVar4) || (dVar4 <= -1.79769313486232e+308)) break;
    if (NAN(dVar4)) {
      printf("Program Exiting as the function returns NaN");
      return 0xf;
    }
    f[stepsize._4_4_] = (dVar3 - dVar4) / ((dVar1 - dVar2) * 2.0);
    x[stepsize._4_4_] = dVar2;
    stepsize._4_4_ = stepsize._4_4_ + 1;
  }
  printf("Program Exiting as the function value exceeds the maximum double value");
  return 0xf;
}

Assistant:

int grad_calc2(custom_function *funcpt, double *x, int N, double *dx, double eps3, double *f) {
	int j,retval;
	double stepsize,stepmax,temp;
	double fp,fm;

	retval = 0;

	for (j = 0; j < N;++j) {
		if (fabs(x[j]) >= 1.0 / fabs(dx[j])) {
			stepmax = x[j];
		}
		else {
			stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
		}

		stepsize = stepmax * eps3;
		temp = x[j];
		x[j] += stepsize;
		stepsize = x[j] - temp;
		fp = FUNCPT_EVAL(funcpt,x,N);
		if (fp >= DBL_MAX || fp <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			return 15;
		}
		if (fp != fp) {
			printf("Program Exiting as the function returns NaN");
			return 15;
		}
		x[j] = temp - stepsize;
		fm = FUNCPT_EVAL(funcpt,x,N);
		if (fm >= DBL_MAX || fm <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			return 15;
		}
		if (fm != fm) {
			printf("Program Exiting as the function returns NaN");
			return 15;
		}
		f[j] = (fp - fm)/ (2 * stepsize);
		x[j] = temp;
	}

	return retval;
}